

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unowned_ptr.cpp
# Opt level: O2

void __thiscall Unowned_Compare_Test::Unowned_Compare_Test(Unowned_Compare_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0018d0f8;
  return;
}

Assistant:

TEST(Unowned, Compare)
{
    int i = 5;
    unowned_ptr<int> pI { &i };
    unowned_ptr<int> pNone {};
    unowned_ptr<int> pNone2 {nullptr};
    EXPECT_EQ(pNone, pNone2);
    EXPECT_NE(pI, pNone);
    EXPECT_EQ(pNone, {});
    EXPECT_EQ(pNone, nullptr);
    EXPECT_EQ(pI, &i);

    int i2 = 5;
    unowned_ptr<int> pI2 { &i2 };
    EXPECT_NE(pI, pI2);
    EXPECT_EQ(*pI, *pI2);
    unowned_ptr<int> pI2Twin { &i2 };
    EXPECT_EQ(pI2, pI2Twin);
    unowned_ptr<int> pI2Copy { pI2 };
    EXPECT_EQ(pI2, pI2Copy);
}